

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

JavascriptFunction * __thiscall Js::BoundFunction::GetTargetFunction(BoundFunction *this)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject **ppRVar3;
  JavascriptProxy *this_00;
  JavascriptFunction *pJVar4;
  undefined4 *puVar5;
  RecyclableObject *local_20;
  RecyclableObject *_targetFunction;
  BoundFunction *this_local;
  
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->targetFunction);
  if (*ppRVar3 != (RecyclableObject *)0x0) {
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->targetFunction);
    local_20 = *ppRVar3;
    while (bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(local_20), bVar2) {
      this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(local_20);
      local_20 = Js::JavascriptProxy::GetTarget(this_00);
    }
    bVar2 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(local_20);
    if (bVar2) {
      pJVar4 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(local_20);
      return pJVar4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x101,"(0)","FALSE");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return (JavascriptFunction *)0x0;
}

Assistant:

JavascriptFunction * BoundFunction::GetTargetFunction() const
    {
        if (targetFunction != nullptr)
        {
            RecyclableObject* _targetFunction = targetFunction;
            while (VarIs<JavascriptProxy>(_targetFunction))
            {
                _targetFunction = VarTo<JavascriptProxy>(_targetFunction)->GetTarget();
            }

            if (VarIs<JavascriptFunction>(_targetFunction))
            {
                return VarTo<JavascriptFunction>(_targetFunction);
            }

            // targetFunction should always be a JavascriptFunction.
            Assert(FALSE);
        }
        return nullptr;
    }